

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

Fl_Tree_Item * __thiscall Fl_Tree::add(Fl_Tree *this,char *path,Fl_Tree_Item *item)

{
  Fl_Tree_Item *pFVar1;
  char **arr;
  
  if (this->_root == (Fl_Tree_Item *)0x0) {
    pFVar1 = (Fl_Tree_Item *)operator_new(0x88);
    Fl_Tree_Item::Fl_Tree_Item(pFVar1,&this->_prefs);
    this->_root = pFVar1;
    pFVar1->_parent = (Fl_Tree_Item *)0x0;
    Fl_Tree_Item::label(pFVar1,"ROOT");
  }
  arr = parse_path(path);
  pFVar1 = Fl_Tree_Item::add(this->_root,&this->_prefs,arr,item);
  free_path(arr);
  return pFVar1;
}

Assistant:

Fl_Tree_Item* Fl_Tree::add(const char *path, Fl_Tree_Item *item) {
  // Tree has no root? make one
  if ( ! _root ) {
#if FLTK_ABI_VERSION >= 10303
    _root = new Fl_Tree_Item(this);
#else
    _root = new Fl_Tree_Item(_prefs);
#endif
    _root->parent(0);
    _root->label("ROOT");
  } 
  // Find parent item via path
  char **arr = parse_path(path);
  item = _root->add(_prefs, arr, item);
  free_path(arr);
  return(item);
}